

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_pclmul_template.h
# Opt level: O1

u32 crc32_x86_vpclmulqdq_avx512_vl512(u32 crc,u8 *p,size_t len)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  ulong uVar15;
  size_t sVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  undefined1 (*pauVar19) [64];
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar22 [16];
  
  auVar30 = ZEXT416(crc);
  if (len < 0x200) {
    if (len < 0x40) {
      if (len < 0x10) {
        if (len < 4) {
          if (len == 0) {
            return crc;
          }
          sVar16 = 0;
          uVar17 = (ulong)crc;
          do {
            crc = (uint)(uVar17 >> 8) ^ crc32_slice1_table[(uint)p[sVar16] ^ crc & 0xff];
            uVar17 = (ulong)crc;
            sVar16 = sVar16 + 1;
          } while (len != sVar16);
          return crc;
        }
        uVar14 = ~(-1 << ((byte)len & 0x1f));
        auVar21 = vmovdqu8_avx512vl(*(undefined1 (*) [16])p);
        auVar22[1] = ((byte)(uVar14 >> 1) & 1) * auVar21[1];
        auVar22[0] = ((byte)uVar14 & 1) * auVar21[0];
        auVar22[2] = ((byte)(uVar14 >> 2) & 1) * auVar21[2];
        auVar22[3] = ((byte)(uVar14 >> 3) & 1) * auVar21[3];
        auVar22[4] = ((byte)(uVar14 >> 4) & 1) * auVar21[4];
        auVar22[5] = ((byte)(uVar14 >> 5) & 1) * auVar21[5];
        auVar22[6] = ((byte)(uVar14 >> 6) & 1) * auVar21[6];
        auVar22[7] = ((byte)(uVar14 >> 7) & 1) * auVar21[7];
        auVar22[8] = ((byte)(uVar14 >> 8) & 1) * auVar21[8];
        auVar22[9] = ((byte)(uVar14 >> 9) & 1) * auVar21[9];
        auVar22[10] = ((byte)(uVar14 >> 10) & 1) * auVar21[10];
        auVar22[0xb] = ((byte)(uVar14 >> 0xb) & 1) * auVar21[0xb];
        auVar22[0xc] = ((byte)(uVar14 >> 0xc) & 1) * auVar21[0xc];
        auVar22[0xd] = ((byte)(uVar14 >> 0xd) & 1) * auVar21[0xd];
        auVar22[0xe] = ((byte)(uVar14 >> 0xe) & 1) * auVar21[0xe];
        auVar22[0xf] = ((byte)(uVar14 >> 0xf) & 1) * auVar21[0xf];
        auVar30 = vpshufb_avx(auVar22 ^ auVar30,*(undefined1 (*) [16])(shift_tab + len));
      }
      else {
        auVar30 = auVar30 ^ *(undefined1 (*) [16])p;
        if (0x1f < len) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = auVar30._0_8_;
          auVar22 = (undefined1  [16])0x0;
          for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
            if ((auVar3 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
              auVar22 = auVar22 ^ ZEXT816(0xae689191) << uVar14;
            }
          }
          auVar10._8_8_ = 0;
          auVar10._0_8_ = auVar30._8_8_;
          auVar30 = (undefined1  [16])0x0;
          for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
            if ((auVar10 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
              auVar30 = auVar30 ^ ZEXT816(0xccaa009e) << uVar14;
            }
          }
          auVar30 = vpternlogq_avx512vl(auVar30,auVar22,*(undefined1 (*) [16])(p + 0x10),0x96);
          if (0x2f < len) {
            auVar4._8_8_ = 0;
            auVar4._0_8_ = auVar30._0_8_;
            auVar22 = (undefined1  [16])0x0;
            for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
              if ((auVar4 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
                auVar22 = auVar22 ^ ZEXT816(0xae689191) << uVar14;
              }
            }
            auVar11._8_8_ = 0;
            auVar11._0_8_ = auVar30._8_8_;
            auVar30 = (undefined1  [16])0x0;
            for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
              if ((auVar11 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
                auVar30 = auVar30 ^ ZEXT816(0xccaa009e) << uVar14;
              }
            }
            auVar30 = vpternlogq_avx512vl(auVar30,auVar22,*(undefined1 (*) [16])(p + 0x20),0x96);
          }
        }
        uVar17 = len & 0xf;
        if (uVar17 != 0) {
          auVar22 = vpshufb_avx(auVar30,*(undefined1 (*) [16])(shift_tab + uVar17));
          auVar30 = vpshufb_avx(auVar30,*(undefined1 (*) [16])(shift_tab + uVar17 + 0x10));
          auVar30 = vpblendvb_avx(auVar30,*(undefined1 (*) [16])
                                           (p + uVar17 + ((ulong)((uint)len & 0x30) - 0x10)),
                                  *(undefined1 (*) [16])(shift_tab + uVar17 + 0x10));
          auVar5._8_8_ = 0;
          auVar5._0_8_ = auVar22._0_8_;
          auVar21 = (undefined1  [16])0x0;
          for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
            if ((auVar5 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
              auVar21 = auVar21 ^ ZEXT816(0xae689191) << uVar14;
            }
          }
          auVar13._8_8_ = 0;
          auVar13._0_8_ = auVar22._8_8_;
          auVar22 = (undefined1  [16])0x0;
          for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
            if ((auVar13 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
              auVar22 = auVar22 ^ ZEXT816(0xccaa009e) << uVar14;
            }
          }
          auVar30 = vpternlogq_avx512vl(auVar22,auVar21,auVar30,0x96);
        }
      }
      auVar7._8_8_ = 0;
      auVar7._0_8_ = auVar30._0_8_;
      auVar22 = (undefined1  [16])0x0;
      for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
        if ((auVar7 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
          auVar22 = auVar22 ^ ZEXT816(0xccaa009e) << uVar14;
        }
      }
      auVar30 = vpsrldq_avx(auVar30,8);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = SUB168(auVar22 ^ auVar30,0);
      auVar30 = (undefined1  [16])0x0;
      for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
        if ((auVar6 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
          auVar30 = auVar30 ^ ZEXT816(0xb4e5b025f7011641) << uVar14;
        }
      }
      auVar8._8_8_ = 0;
      auVar8._0_8_ = auVar30._0_8_;
      auVar30 = (undefined1  [16])0x0;
      for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
        if ((auVar8 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
          auVar30 = auVar30 ^ ZEXT816(0x1db710641) << uVar14;
        }
      }
      return auVar22._8_4_ ^ auVar30._8_4_;
    }
    auVar23 = vpxorq_avx512f(ZEXT1664(auVar30),*(undefined1 (*) [64])p);
    if (len < 0x80) goto LAB_0010c0fc;
    auVar24 = vmovdqu64_avx512f(*(undefined1 (*) [64])(p + 0x40));
    if (0xff < len) {
      auVar28 = vmovdqu64_avx512f(*(undefined1 (*) [64])(p + 0x80));
      auVar29 = vmovdqu64_avx512f(*(undefined1 (*) [64])(p + 0xc0));
      pauVar19 = (undefined1 (*) [64])(p + 0x100);
      goto LAB_0010c044;
    }
    pauVar19 = (undefined1 (*) [64])(p + 0x80);
  }
  else {
    if ((len < 0x10001) || (((ulong)p & 0x3f) == 0)) {
      auVar24 = vpxorq_avx512f(ZEXT1664(auVar30),*(undefined1 (*) [64])p);
    }
    else {
      uVar14 = (uint)-(long)p;
      auVar30 = auVar30 ^ *(undefined1 (*) [16])p;
      uVar15 = (ulong)(uVar14 & 0x3f);
      pauVar18 = (undefined1 (*) [16])(p + 0x10);
      uVar20 = -(long)p & 0xf;
      uVar17 = uVar15;
      if (uVar20 != 0) {
        auVar22 = vpshufb_avx(auVar30,*(undefined1 (*) [16])(shift_tab + uVar20 + 0x10));
        auVar22 = vpblendvb_avx(auVar22,*(undefined1 (*) [16])(p + uVar20),
                                *(undefined1 (*) [16])(shift_tab + uVar20 + 0x10));
        auVar30 = vpshufb_avx(auVar30,*(undefined1 (*) [16])(shift_tab + uVar20));
        pauVar18 = (undefined1 (*) [16])(*pauVar18 + uVar20);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = auVar30._0_8_;
        auVar21 = (undefined1  [16])0x0;
        for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
          if ((auVar2 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
            auVar21 = auVar21 ^ ZEXT816(0xae689191) << uVar1;
          }
        }
        auVar9._8_8_ = 0;
        auVar9._0_8_ = auVar30._8_8_;
        auVar30 = (undefined1  [16])0x0;
        for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
          if ((auVar9 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
            auVar30 = auVar30 ^ ZEXT816(0xccaa009e) << uVar1;
          }
        }
        auVar30 = vpternlogq_avx512vl(auVar30,auVar21,auVar22,0x96);
        uVar17 = (ulong)(uVar14 & 0x30);
      }
      for (; uVar17 != 0; uVar17 = uVar17 - 0x10) {
        auVar21._8_8_ = 0;
        auVar21._0_8_ = auVar30._0_8_;
        auVar22 = (undefined1  [16])0x0;
        for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
          if ((auVar21 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
            auVar22 = auVar22 ^ ZEXT816(0xae689191) << uVar14;
          }
        }
        auVar12._8_8_ = 0;
        auVar12._0_8_ = auVar30._8_8_;
        auVar30 = (undefined1  [16])0x0;
        for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
          if ((auVar12 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
            auVar30 = auVar30 ^ ZEXT816(0xccaa009e) << uVar14;
          }
        }
        auVar30 = vpternlogq_avx512vl(auVar30,auVar22,*pauVar18,0x96);
        pauVar18 = pauVar18 + 1;
      }
      auVar24 = vinserti32x4_avx512f(ZEXT1664(auVar30),*pauVar18,1);
      len = len - uVar15;
      auVar24 = vinserti64x4_avx512f(auVar24,*(undefined1 (*) [32])(pauVar18 + 1),1);
      p = (u8 *)(pauVar18 + -1);
    }
    auVar28 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)p + 0x40));
    auVar29 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)p + 0x80));
    auVar31 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)p + 0xc0));
    auVar23 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)p + 0x100));
    auVar32 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)p + 0x140));
    auVar33 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)p + 0x180));
    auVar25 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)p + 0x1c0));
    pauVar19 = (undefined1 (*) [64])((long)p + 0x200);
    if (0x3ff < len) {
      auVar26 = vpbroadcastq_avx512f(ZEXT816(0x1072db28));
      auVar27 = vpbroadcastq_avx512f(ZEXT816(0xc30f51d));
      do {
        p = (u8 *)pauVar19;
        auVar34 = vpclmulqdq_vpclmulqdq(auVar24,auVar26,0);
        auVar24 = vpclmulqdq_vpclmulqdq(auVar24,auVar27,0x11);
        auVar24 = vpternlogd_avx512f(auVar24,auVar34,*(undefined1 (*) [64])p,0x96);
        auVar34 = vpclmulqdq_vpclmulqdq(auVar28,auVar26,0);
        auVar28 = vpclmulqdq_vpclmulqdq(auVar28,auVar27,0x11);
        auVar28 = vpternlogd_avx512f(auVar28,auVar34,*(undefined1 (*) [64])((long)p + 0x40),0x96);
        auVar34 = vpclmulqdq_vpclmulqdq(auVar29,auVar26,0);
        auVar29 = vpclmulqdq_vpclmulqdq(auVar29,auVar27,0x11);
        auVar29 = vpternlogd_avx512f(auVar29,auVar34,*(undefined1 (*) [64])((long)p + 0x80),0x96);
        auVar34 = vpclmulqdq_vpclmulqdq(auVar31,auVar26,0);
        auVar31 = vpclmulqdq_vpclmulqdq(auVar31,auVar27,0x11);
        auVar31 = vpternlogd_avx512f(auVar31,auVar34,*(undefined1 (*) [64])((long)p + 0xc0),0x96);
        auVar34 = vpclmulqdq_vpclmulqdq(auVar23,auVar26,0);
        auVar23 = vpclmulqdq_vpclmulqdq(auVar23,auVar27,0x11);
        auVar23 = vpternlogd_avx512f(auVar23,auVar34,*(undefined1 (*) [64])((long)p + 0x100),0x96);
        auVar34 = vpclmulqdq_vpclmulqdq(auVar32,auVar26,0);
        auVar32 = vpclmulqdq_vpclmulqdq(auVar32,auVar27,0x11);
        auVar32 = vpternlogd_avx512f(auVar32,auVar34,*(undefined1 (*) [64])((long)p + 0x140),0x96);
        auVar34 = vpclmulqdq_vpclmulqdq(auVar33,auVar26,0);
        auVar33 = vpclmulqdq_vpclmulqdq(auVar33,auVar27,0x11);
        auVar33 = vpternlogd_avx512f(auVar33,auVar34,*(undefined1 (*) [64])((long)p + 0x180),0x96);
        auVar34 = vpclmulqdq_vpclmulqdq(auVar25,auVar26,0);
        auVar25 = vpclmulqdq_vpclmulqdq(auVar25,auVar27,0x11);
        auVar25 = vpternlogd_avx512f(auVar25,auVar34,*(undefined1 (*) [64])((long)p + 0x1c0),0x96);
        len = len - 0x200;
        pauVar19 = (undefined1 (*) [64])((long)p + 0x200);
      } while (0x3ff < len);
    }
    auVar26 = vpbroadcastq_avx512f(ZEXT816(0xce3371cb));
    auVar34 = vpclmulqdq_vpclmulqdq(auVar24,auVar26,0);
    auVar27 = vpbroadcastq_avx512f(ZEXT816(0xe95c1271));
    auVar24 = vpclmulqdq_vpclmulqdq(auVar24,auVar27,0x11);
    auVar23 = vpternlogd_avx512f(auVar24,auVar34,auVar23,0x96);
    auVar34 = vpclmulqdq_vpclmulqdq(auVar28,auVar26,0);
    auVar24 = vpclmulqdq_vpclmulqdq(auVar28,auVar27,0x11);
    auVar24 = vpternlogd_avx512f(auVar24,auVar34,auVar32,0x96);
    auVar32 = vpclmulqdq_vpclmulqdq(auVar29,auVar26,0);
    auVar28 = vpclmulqdq_vpclmulqdq(auVar29,auVar27,0x11);
    auVar28 = vpternlogd_avx512f(auVar28,auVar32,auVar33,0x96);
    auVar32 = vpclmulqdq_vpclmulqdq(auVar31,auVar26,0);
    auVar29 = vpclmulqdq_vpclmulqdq(auVar31,auVar27,0x11);
    auVar29 = vpternlogd_avx512f(auVar29,auVar32,auVar25,0x96);
    if (((uint)len >> 8 & 1) != 0) {
      auVar32 = vpclmulqdq_vpclmulqdq(auVar23,auVar26,0);
      auVar31 = vpclmulqdq_vpclmulqdq(auVar23,auVar27,0x11);
      auVar23 = vpternlogd_avx512f(auVar31,auVar32,*pauVar19,0x96);
      auVar31 = vpclmulqdq_vpclmulqdq(auVar24,auVar26,0);
      auVar24 = vpclmulqdq_vpclmulqdq(auVar24,auVar27,0x11);
      auVar24 = vpternlogd_avx512f(auVar24,auVar31,*(undefined1 (*) [64])((long)p + 0x240),0x96);
      auVar31 = vpclmulqdq_vpclmulqdq(auVar28,auVar26,0);
      auVar28 = vpclmulqdq_vpclmulqdq(auVar28,auVar27,0x11);
      auVar28 = vpternlogd_avx512f(auVar28,auVar31,*(undefined1 (*) [64])((long)p + 0x280),0x96);
      auVar31 = vpclmulqdq_vpclmulqdq(auVar29,auVar26,0);
      auVar29 = vpclmulqdq_vpclmulqdq(auVar29,auVar27,0x11);
      auVar29 = vpternlogd_avx512f(auVar29,auVar31,*(undefined1 (*) [64])((long)p + 0x2c0),0x96);
      pauVar19 = (undefined1 (*) [64])((long)p + 0x300);
    }
LAB_0010c044:
    auVar31 = vpbroadcastq_avx512f(ZEXT816(0x33fff533));
    auVar33 = vpclmulqdq_vpclmulqdq(auVar23,auVar31,0);
    auVar32 = vpbroadcastq_avx512f(ZEXT816(0x910eeec1));
    auVar23 = vpclmulqdq_vpclmulqdq(auVar23,auVar32,0x11);
    auVar23 = vpternlogd_avx512f(auVar23,auVar33,auVar28,0x96);
    auVar28 = vpclmulqdq_vpclmulqdq(auVar24,auVar31,0);
    auVar24 = vpclmulqdq_vpclmulqdq(auVar24,auVar32,0x11);
    auVar24 = vpternlogd_avx512f(auVar24,auVar28,auVar29,0x96);
    if ((char)len < '\0') {
      auVar29 = vpclmulqdq_vpclmulqdq(auVar23,auVar31,0);
      auVar28 = vpclmulqdq_vpclmulqdq(auVar23,auVar32,0x11);
      auVar23 = vpternlogd_avx512f(auVar28,auVar29,*pauVar19,0x96);
      auVar28 = vpclmulqdq_vpclmulqdq(auVar24,auVar31,0);
      auVar24 = vpclmulqdq_vpclmulqdq(auVar24,auVar32,0x11);
      auVar24 = vpternlogd_avx512f(auVar24,auVar28,pauVar19[1],0x96);
      pauVar19 = pauVar19 + 2;
    }
  }
  auVar28 = vpbroadcastq_avx512f(ZEXT816(0x8f352d95));
  auVar29 = vpbroadcastq_avx512f(ZEXT816(0x1d9513d7));
  auVar32 = vpclmulqdq_vpclmulqdq(auVar23,auVar28,0);
  auVar31 = vpclmulqdq_vpclmulqdq(auVar23,auVar29,0x11);
  auVar23 = vpternlogd_avx512f(auVar31,auVar32,auVar24,0x96);
  if ((len & 0x40) != 0) {
    auVar28 = vpclmulqdq_vpclmulqdq(auVar23,auVar28,0);
    auVar24 = vpclmulqdq_vpclmulqdq(auVar23,auVar29,0x11);
    auVar23 = vpternlogd_avx512f(auVar24,auVar28,*pauVar19,0x96);
  }
LAB_0010c0fc:
  vextracti64x4_avx512f(auVar23,1);
  halt_baddata();
}

Assistant:

static ATTRIBUTES u32
ADD_SUFFIX(crc32_x86)(u32 crc, const u8 *p, size_t len)
{
	/*
	 * mults_{N}v are the vectors of multipliers for folding across N vec_t
	 * vectors, i.e. N*VL*8 bits.  mults_128b are the two multipliers for
	 * folding across 128 bits.  mults_128b differs from mults_1v when
	 * VL != 16.  All multipliers are 64-bit, to match what pclmulqdq needs,
	 * but since this is for CRC-32 only their low 32 bits are nonzero.
	 * For more details, see scripts/gen-crc32-consts.py.
	 */
	const vec_t mults_8v = MULTS_8V;
	const vec_t mults_4v = MULTS_4V;
	const vec_t mults_2v = MULTS_2V;
	const vec_t mults_1v = MULTS_1V;
	const __m128i mults_128b = _mm_set_epi64x(CRC32_X95_MODG, CRC32_X159_MODG);
	const __m128i barrett_reduction_constants =
		_mm_set_epi64x(CRC32_BARRETT_CONSTANT_2, CRC32_BARRETT_CONSTANT_1);
	vec_t v0, v1, v2, v3, v4, v5, v6, v7;
	__m128i x0 = _mm_cvtsi32_si128(crc);
	__m128i x1;

	if (len < 8*VL) {
		if (len < VL) {
			STATIC_ASSERT(VL == 16 || VL == 32 || VL == 64);
			if (len < 16) {
			#if USE_AVX512
				if (len < 4)
					return crc32_slice1(crc, p, len);
				/*
				 * Handle 4 <= len <= 15 bytes by doing a masked
				 * load, XOR'ing the current CRC with the first
				 * 4 bytes, left-shifting by '16 - len' bytes to
				 * align the result to the end of x0 (so that it
				 * becomes the low-order coefficients of a
				 * 128-bit polynomial), and then doing the usual
				 * reduction from 128 bits to 32 bits.
				 */
				x0 = _mm_xor_si128(
					x0, _mm_maskz_loadu_epi8((1 << len) - 1, p));
				x0 = _mm_shuffle_epi8(
					x0, _mm_loadu_si128((const void *)&shift_tab[len]));
				goto reduce_x0;
			#else
				return crc32_slice1(crc, p, len);
			#endif
			}
			/*
			 * Handle 16 <= len < VL bytes where VL is 32 or 64.
			 * Use 128-bit instructions so that these lengths aren't
			 * slower with VL > 16 than with VL=16.
			 */
			x0 = _mm_xor_si128(_mm_loadu_si128((const void *)p), x0);
			if (len >= 32) {
				x0 = fold_vec128(x0, _mm_loadu_si128((const void *)(p + 16)),
						 mults_128b);
				if (len >= 48)
					x0 = fold_vec128(x0, _mm_loadu_si128((const void *)(p + 32)),
							 mults_128b);
			}
			p += len & ~15;
			goto less_than_16_remaining;
		}
		v0 = VXOR(VLOADU(p), M128I_TO_VEC(x0));
		if (len < 2*VL) {
			p += VL;
			goto less_than_vl_remaining;
		}
		v1 = VLOADU(p + 1*VL);
		if (len < 4*VL) {
			p += 2*VL;
			goto less_than_2vl_remaining;
		}
		v2 = VLOADU(p + 2*VL);
		v3 = VLOADU(p + 3*VL);
		p += 4*VL;
	} else {
		/*
		 * If the length is large and the pointer is misaligned, align
		 * it.  For smaller lengths, just take the misaligned load
		 * penalty.  Note that on recent x86 CPUs, vmovdqu with an
		 * aligned address is just as fast as vmovdqa, so there's no
		 * need to use vmovdqa in the main loop.
		 */
		if (len > 65536 && ((uintptr_t)p & (VL-1))) {
			size_t align = -(uintptr_t)p & (VL-1);

			len -= align;
			x0 = _mm_xor_si128(_mm_loadu_si128((const void *)p), x0);
			p += 16;
			if (align & 15) {
				x0 = fold_lessthan16bytes(x0, p, align & 15,
							  mults_128b);
				p += align & 15;
				align &= ~15;
			}
			while (align) {
				x0 = fold_vec128(x0, *(const __m128i *)p,
						 mults_128b);
				p += 16;
				align -= 16;
			}
			v0 = M128I_TO_VEC(x0);
		#  if VL == 32
			v0 = _mm256_inserti128_si256(v0, *(const __m128i *)p, 1);
		#  elif VL == 64
			v0 = _mm512_inserti32x4(v0, *(const __m128i *)p, 1);
			v0 = _mm512_inserti64x4(v0, *(const __m256i *)(p + 16), 1);
		#  endif
			p -= 16;
		} else {
			v0 = VXOR(VLOADU(p), M128I_TO_VEC(x0));
		}
		v1 = VLOADU(p + 1*VL);
		v2 = VLOADU(p + 2*VL);
		v3 = VLOADU(p + 3*VL);
		v4 = VLOADU(p + 4*VL);
		v5 = VLOADU(p + 5*VL);
		v6 = VLOADU(p + 6*VL);
		v7 = VLOADU(p + 7*VL);
		p += 8*VL;

		/*
		 * This is the main loop, processing 8*VL bytes per iteration.
		 * 4*VL is usually enough and would result in smaller code, but
		 * Skylake and Cascade Lake need 8*VL to get full performance.
		 */
		while (len >= 16*VL) {
			v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_8v);
			v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_8v);
			v2 = fold_vec(v2, VLOADU(p + 2*VL), mults_8v);
			v3 = fold_vec(v3, VLOADU(p + 3*VL), mults_8v);
			v4 = fold_vec(v4, VLOADU(p + 4*VL), mults_8v);
			v5 = fold_vec(v5, VLOADU(p + 5*VL), mults_8v);
			v6 = fold_vec(v6, VLOADU(p + 6*VL), mults_8v);
			v7 = fold_vec(v7, VLOADU(p + 7*VL), mults_8v);
			p += 8*VL;
			len -= 8*VL;
		}

		/* Fewer than 8*VL bytes remain. */
		v0 = fold_vec(v0, v4, mults_4v);
		v1 = fold_vec(v1, v5, mults_4v);
		v2 = fold_vec(v2, v6, mults_4v);
		v3 = fold_vec(v3, v7, mults_4v);
		if (len & (4*VL)) {
			v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_4v);
			v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_4v);
			v2 = fold_vec(v2, VLOADU(p + 2*VL), mults_4v);
			v3 = fold_vec(v3, VLOADU(p + 3*VL), mults_4v);
			p += 4*VL;
		}
	}
	/* Fewer than 4*VL bytes remain. */
	v0 = fold_vec(v0, v2, mults_2v);
	v1 = fold_vec(v1, v3, mults_2v);
	if (len & (2*VL)) {
		v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_2v);
		v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_2v);
		p += 2*VL;
	}
less_than_2vl_remaining:
	/* Fewer than 2*VL bytes remain. */
	v0 = fold_vec(v0, v1, mults_1v);
	if (len & VL) {
		v0 = fold_vec(v0, VLOADU(p), mults_1v);
		p += VL;
	}
less_than_vl_remaining:
	/*
	 * Fewer than VL bytes remain.  Reduce v0 (length VL bytes) to x0
	 * (length 16 bytes) and fold in any 16-byte data segments that remain.
	 */
#if VL == 16
	x0 = v0;
#else
	{
	#if VL == 32
		__m256i y0 = v0;
	#else
		const __m256i mults_256b =
			_mm256_set_epi64x(CRC32_X223_MODG, CRC32_X287_MODG,
					  CRC32_X223_MODG, CRC32_X287_MODG);
		__m256i y0 = fold_vec256(_mm512_extracti64x4_epi64(v0, 0),
					 _mm512_extracti64x4_epi64(v0, 1),
					 mults_256b);
		if (len & 32) {
			y0 = fold_vec256(y0, _mm256_loadu_si256((const void *)p),
					 mults_256b);
			p += 32;
		}
	#endif
		x0 = fold_vec128(_mm256_extracti128_si256(y0, 0),
				 _mm256_extracti128_si256(y0, 1), mults_128b);
	}
	if (len & 16) {
		x0 = fold_vec128(x0, _mm_loadu_si128((const void *)p),
				 mults_128b);
		p += 16;
	}
#endif
less_than_16_remaining:
	len &= 15;

	/* Handle any remainder of 1 to 15 bytes. */
	if (len)
		x0 = fold_lessthan16bytes(x0, p, len, mults_128b);
#if USE_AVX512
reduce_x0:
#endif
	/*
	 * Multiply the remaining 128-bit message polynomial 'x0' by x^32, then
	 * reduce it modulo the generator polynomial G.  This gives the CRC.
	 *
	 * This implementation matches that used in crc-pclmul-template.S from
	 * https://lore.kernel.org/r/20250210174540.161705-4-ebiggers@kernel.org/
	 * with the parameters n=32 and LSB_CRC=1 (what the gzip CRC uses).  See
	 * there for a detailed explanation of the math used here.
	 */
	x0 = _mm_xor_si128(_mm_clmulepi64_si128(x0, mults_128b, 0x10),
			   _mm_bsrli_si128(x0, 8));
	x1 = _mm_clmulepi64_si128(x0, barrett_reduction_constants, 0x00);
	x1 = _mm_clmulepi64_si128(x1, barrett_reduction_constants, 0x10);
	x0 = _mm_xor_si128(x0, x1);
	return _mm_extract_epi32(x0, 2);
}